

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O1

void __thiscall BVFixed::Copy(BVFixed *this,BVFixed *bv)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  BVIndex BVar4;
  undefined4 *puVar5;
  
  AssertBV(this,bv);
  if (this->len < bv->len) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVector.cpp"
                       ,0xf3,"(len >= bv->len)","len >= bv->len");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  BVar3 = WordCount(this->len);
  BVar4 = WordCount(bv->len);
  js_memcpy_s(this + 1,(ulong)(BVar3 * 8),bv + 1,(ulong)(BVar4 * 8));
  return;
}

Assistant:

void
BVFixed::Copy(const BVFixed*bv)
{
    AssertBV(bv);
    Assert(len >= bv->len);

#if 1
    js_memcpy_s(&this->data[0], WordCount() * sizeof(BVUnit), &bv->data[0], bv->WordCount() * sizeof(BVUnit));
#else
    this->for_each(bv, &BVUnit::Copy);
#endif
}